

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURL * curl_easy_duphandle(CURL *d)

{
  CURLcode CVar1;
  Curl_easy *data_00;
  CookieInfo *pCVar2;
  curl_slist *pcVar3;
  char *pcVar4;
  altsvcinfo *paVar5;
  hsts *phVar6;
  Curl_easy *outcurl;
  Curl_easy *data;
  CURL *d_local;
  
  data_00 = (Curl_easy *)(*Curl_ccalloc)(1,0x14d8);
  if (data_00 != (Curl_easy *)0x0) {
    (data_00->set).buffer_size = *(uint *)((long)d + 0x68c);
    Curl_hash_init(&data_00->meta_hash,0x17,Curl_hash_str,Curl_str_key_compare,
                   dupeasy_meta_freeentry);
    Curl_dyn_init(&(data_00->state).headerb,0x19000);
    Curl_netrc_init(&(data_00->state).netrc);
    (data_00->state).lastconnect_id = -1;
    (data_00->state).recent_conn_id = -1;
    data_00->id = -1;
    data_00->mid = 0xffffffff;
    data_00->master_mid = 0xffffffff;
    Curl_llist_init(&(data_00->state).httphdrs,(Curl_llist_dtor)0x0);
    Curl_initinfo(data_00);
    CVar1 = dupset(data_00,(Curl_easy *)d);
    if (CVar1 == CURLE_OK) {
      (data_00->progress).flags = *(int *)((long)d + 0xacc);
      (data_00->progress).field_0x1ac =
           (data_00->progress).field_0x1ac & 0xfe | *(byte *)((long)d + 0xbfc) & 1;
      (data_00->state).cookielist = (curl_slist *)0x0;
      if ((*(long *)((long)d + 0xa38) != 0) && ((*(uint *)((long)d + 0x13be) >> 0xd & 1) != 0)) {
        pCVar2 = Curl_cookie_init(data_00,(char *)0x0,data_00->cookies,
                                  (*(ulong *)((long)d + 0xa2c) >> 7 & 1) != 0);
        data_00->cookies = pCVar2;
        if (data_00->cookies == (CookieInfo *)0x0) goto LAB_00136f5a;
      }
      if (*(long *)((long)d + 0x1308) != 0) {
        pcVar3 = Curl_slist_duplicate(*(curl_slist **)((long)d + 0x1308));
        (data_00->state).cookielist = pcVar3;
        if ((data_00->state).cookielist == (curl_slist *)0x0) goto LAB_00136f5a;
      }
      if (*(long *)((long)d + 0x1228) != 0) {
        pcVar4 = (*Curl_cstrdup)(*(char **)((long)d + 0x1228));
        (data_00->state).url = pcVar4;
        if ((data_00->state).url == (char *)0x0) goto LAB_00136f5a;
        *(uint *)&(data_00->state).field_0x7be =
             *(uint *)&(data_00->state).field_0x7be & 0xfffeffff | 0x10000;
      }
      if (*(long *)((long)d + 0x1230) != 0) {
        pcVar4 = (*Curl_cstrdup)(*(char **)((long)d + 0x1230));
        (data_00->state).referer = pcVar4;
        if ((data_00->state).referer == (char *)0x0) goto LAB_00136f5a;
        *(uint *)&(data_00->state).field_0x7be =
             *(uint *)&(data_00->state).field_0x7be & 0xfffdffff | 0x20000;
      }
      if (((data_00->set).str[0x2c] == (char *)0x0) ||
         (CVar1 = Curl_ssl_set_engine(data_00,(data_00->set).str[0x2c]), CVar1 == CURLE_OK)) {
        if (*(long *)((long)d + 0xa48) != 0) {
          paVar5 = Curl_altsvc_init();
          data_00->asi = paVar5;
          if (data_00->asi == (altsvcinfo *)0x0) goto LAB_00136f5a;
          if ((data_00->set).str[0x40] != (char *)0x0) {
            Curl_altsvc_load(data_00->asi,(data_00->set).str[0x40]);
          }
        }
        if (*(long *)((long)d + 0xa40) != 0) {
          phVar6 = Curl_hsts_init();
          data_00->hsts = phVar6;
          if (data_00->hsts == (hsts *)0x0) goto LAB_00136f5a;
          if ((data_00->set).str[0x41] != (char *)0x0) {
            Curl_hsts_loadfile(data_00,data_00->hsts,(data_00->set).str[0x41]);
          }
          Curl_hsts_loadcb(data_00,data_00->hsts);
        }
        data_00->magic = 0xc0dedbad;
        return data_00;
      }
    }
  }
LAB_00136f5a:
  if (data_00 != (Curl_easy *)0x0) {
    (*Curl_cfree)(data_00->cookies);
    Curl_dyn_free(&(data_00->state).headerb);
    Curl_altsvc_cleanup(&data_00->asi);
    Curl_hsts_cleanup(&data_00->hsts);
    Curl_freeset(data_00);
    (*Curl_cfree)(data_00);
  }
  return (CURL *)0x0;
}

Assistant:

CURL *curl_easy_duphandle(CURL *d)
{
  struct Curl_easy *data = d;
  struct Curl_easy *outcurl = calloc(1, sizeof(struct Curl_easy));
  if(!outcurl)
    goto fail;

  /*
   * We setup a few buffers we need. We should probably make them
   * get setup on-demand in the code, as that would probably decrease
   * the likeliness of us forgetting to init a buffer here in the future.
   */
  outcurl->set.buffer_size = data->set.buffer_size;

  Curl_hash_init(&outcurl->meta_hash, 23,
                 Curl_hash_str, Curl_str_key_compare, dupeasy_meta_freeentry);
  Curl_dyn_init(&outcurl->state.headerb, CURL_MAX_HTTP_HEADER);
  Curl_netrc_init(&outcurl->state.netrc);

  /* the connection pool is setup on demand */
  outcurl->state.lastconnect_id = -1;
  outcurl->state.recent_conn_id = -1;
  outcurl->id = -1;
  outcurl->mid = UINT_MAX;
  outcurl->master_mid = UINT_MAX;

#ifndef CURL_DISABLE_HTTP
  Curl_llist_init(&outcurl->state.httphdrs, NULL);
#endif
  Curl_initinfo(outcurl);

  /* copy all userdefined values */
  if(dupset(outcurl, data))
    goto fail;

  outcurl->progress.flags    = data->progress.flags;
  outcurl->progress.callback = data->progress.callback;

#ifndef CURL_DISABLE_COOKIES
  outcurl->state.cookielist = NULL;
  if(data->cookies && data->state.cookie_engine) {
    /* If cookies are enabled in the parent handle, we enable them
       in the clone as well! */
    outcurl->cookies = Curl_cookie_init(outcurl, NULL, outcurl->cookies,
                                        data->set.cookiesession);
    if(!outcurl->cookies)
      goto fail;
  }

  if(data->state.cookielist) {
    outcurl->state.cookielist = Curl_slist_duplicate(data->state.cookielist);
    if(!outcurl->state.cookielist)
      goto fail;
  }
#endif

  if(data->state.url) {
    outcurl->state.url = strdup(data->state.url);
    if(!outcurl->state.url)
      goto fail;
    outcurl->state.url_alloc = TRUE;
  }

  if(data->state.referer) {
    outcurl->state.referer = strdup(data->state.referer);
    if(!outcurl->state.referer)
      goto fail;
    outcurl->state.referer_alloc = TRUE;
  }

  /* Reinitialize an SSL engine for the new handle
   * note: the engine name has already been copied by dupset */
  if(outcurl->set.str[STRING_SSL_ENGINE]) {
    if(Curl_ssl_set_engine(outcurl, outcurl->set.str[STRING_SSL_ENGINE]))
      goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi) {
    outcurl->asi = Curl_altsvc_init();
    if(!outcurl->asi)
      goto fail;
    if(outcurl->set.str[STRING_ALTSVC])
      (void)Curl_altsvc_load(outcurl->asi, outcurl->set.str[STRING_ALTSVC]);
  }
#endif
#ifndef CURL_DISABLE_HSTS
  if(data->hsts) {
    outcurl->hsts = Curl_hsts_init();
    if(!outcurl->hsts)
      goto fail;
    if(outcurl->set.str[STRING_HSTS])
      (void)Curl_hsts_loadfile(outcurl,
                               outcurl->hsts, outcurl->set.str[STRING_HSTS]);
    (void)Curl_hsts_loadcb(outcurl, outcurl->hsts);
  }
#endif

  outcurl->magic = CURLEASY_MAGIC_NUMBER;

  /* we reach this point and thus we are OK */

  return outcurl;

fail:

  if(outcurl) {
#ifndef CURL_DISABLE_COOKIES
    free(outcurl->cookies);
#endif
    Curl_dyn_free(&outcurl->state.headerb);
    Curl_altsvc_cleanup(&outcurl->asi);
    Curl_hsts_cleanup(&outcurl->hsts);
    Curl_freeset(outcurl);
    free(outcurl);
  }

  return NULL;
}